

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.c
# Opt level: O3

argparse_result_t argparse_exec(int argc,char **argv,argparse_callback_fn *callback)

{
  bool bVar1;
  bool bVar2;
  adt_error_t aVar3;
  char cVar4;
  int32_t iVar5;
  argparse_result_t aVar6;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  adt_str_t long_name;
  adt_str_t short_name;
  adt_str_t str;
  adt_str_t local_80;
  adt_str_t local_68;
  ulong local_50;
  adt_str_t local_48;
  
  aVar6 = ARGPARSE_SUCCESS;
  if ((1 < argc) &&
     (aVar6 = ARGPARSE_INVALID_ARGUMENT_ERROR,
     callback != (argparse_callback_fn *)0x0 && argv != (char **)0x0)) {
    adt_str_create(&local_48);
    adt_str_create(&local_68);
    adt_str_create(&local_80);
    local_50 = (ulong)(uint)argc;
    uVar10 = 1;
    bVar1 = false;
    bVar2 = false;
    do {
      pcVar11 = argv[uVar10];
      adt_str_clear(&local_48);
      cVar4 = *pcVar11;
      lVar9 = 0;
      if (cVar4 == '-') {
        do {
          cVar4 = pcVar11[lVar9 + 1];
          lVar9 = lVar9 + 1;
        } while (cVar4 == '-');
        pcVar11 = pcVar11 + lVar9;
      }
      pcVar12 = pcVar11 + 2;
      while ((pcVar11 = pcVar11 + 1, cVar4 != '\0' && (cVar4 != '='))) {
        adt_str_push(&local_48,(int)cVar4);
        pcVar12 = pcVar12 + 1;
        cVar4 = *pcVar11;
      }
      iVar5 = adt_str_length(&local_48);
      uVar8 = (uint)lVar9;
      if (uVar8 < 3 && 0 < iVar5) {
        if (uVar8 != 2) {
          if (uVar8 == 1) {
            if (cVar4 != '=') {
              pcVar11 = adt_str_cstr(&local_48);
              aVar6 = (*callback)(pcVar11,(char *)0x0,(char *)0x0);
              if (aVar6 != ARGPARSE_NEED_VALUE) goto LAB_0013a289;
              cVar4 = adt_str_set(&local_68,&local_48);
              bVar1 = true;
              goto LAB_0013a212;
            }
            aVar3 = adt_str_set(&local_68,&local_48);
            if (aVar3 != '\0') goto LAB_0013a2a3;
            adt_str_clear(&local_48);
            cVar4 = *pcVar11;
            while (cVar4 != '\0') {
              adt_str_push(&local_48,(int)cVar4);
              cVar4 = *pcVar12;
              pcVar12 = pcVar12 + 1;
            }
            pcVar11 = adt_str_cstr(&local_68);
            pcVar7 = adt_str_cstr(&local_48);
          }
          else if (bVar1) {
            pcVar11 = adt_str_cstr(&local_68);
            pcVar7 = adt_str_cstr(&local_48);
            bVar1 = false;
          }
          else {
            if (bVar2) {
              pcVar12 = adt_str_cstr(&local_80);
              pcVar7 = adt_str_cstr(&local_48);
              bVar2 = false;
              goto LAB_0013a271;
            }
            pcVar7 = adt_str_cstr(&local_48);
            pcVar11 = (char *)0x0;
          }
          pcVar12 = (char *)0x0;
          goto LAB_0013a287;
        }
        if (cVar4 == '=') {
          aVar3 = adt_str_set(&local_80,&local_48);
          if (aVar3 == '\0') {
            adt_str_clear(&local_48);
            cVar4 = *pcVar11;
            while (cVar4 != '\0') {
              adt_str_push(&local_48,(int)cVar4);
              cVar4 = *pcVar12;
              pcVar12 = pcVar12 + 1;
            }
            pcVar12 = adt_str_cstr(&local_80);
            pcVar7 = adt_str_cstr(&local_48);
LAB_0013a271:
            pcVar11 = (char *)0x0;
            goto LAB_0013a287;
          }
LAB_0013a2a3:
          aVar6 = ARGPARSE_MEM_ERROR;
          goto LAB_0013a2a9;
        }
        pcVar11 = adt_str_cstr(&local_48);
        aVar6 = (*callback)((char *)0x0,pcVar11,(char *)0x0);
        if (aVar6 != ARGPARSE_NEED_VALUE) goto LAB_0013a289;
        cVar4 = adt_str_set(&local_80,&local_48);
        bVar2 = true;
LAB_0013a212:
        if (cVar4 != '\0') goto LAB_0013a2a3;
      }
      else {
        aVar6 = ARGPARSE_PARSE_ERROR;
        if ((iVar5 != 0) || (uVar8 != 1)) goto LAB_0013a2a9;
        if (bVar1) {
          pcVar11 = adt_str_cstr(&local_68);
          bVar1 = false;
LAB_0013a192:
          pcVar12 = (char *)0x0;
        }
        else {
          if (!bVar2) {
            pcVar11 = (char *)0x0;
            goto LAB_0013a192;
          }
          pcVar12 = adt_str_cstr(&local_80);
          bVar2 = false;
          pcVar11 = (char *)0x0;
        }
        pcVar7 = "-";
LAB_0013a287:
        aVar6 = (*callback)(pcVar11,pcVar12,pcVar7);
LAB_0013a289:
        if (aVar6 < ARGPARSE_SUCCESS) goto LAB_0013a2a9;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_50);
    aVar6 = ARGPARSE_SUCCESS;
LAB_0013a2a9:
    adt_str_destroy(&local_48);
    adt_str_destroy(&local_68);
    adt_str_destroy(&local_80);
  }
  return aVar6;
}

Assistant:

argparse_result_t argparse_exec(int argc, const char **argv, argparse_callback_fn *callback)
{
   if ( argc < 2)
   {
      return ARGPARSE_SUCCESS; //Nothing to parse
   }
   if ( (argv != 0) && (callback != 0) )
   {
      int arg_id;
      adt_str_t short_name;
      adt_str_t long_name;
      adt_str_t str;
      bool has_short_name = false;
      bool has_long_name = false;
      adt_str_create(&str);
      adt_str_create(&short_name);
      adt_str_create(&long_name);

      for (arg_id = 1; arg_id < argc; arg_id++)
      {
         char c;
         int arg_len;
         unsigned int minus_count = 0u;
         unsigned int equal_count = 0u;
         const char *p = argv[arg_id];
         adt_str_clear(&str);
         for(c= *p; c == '-'; c = *(++p))
         {
            minus_count++;
         }
         for(c = *p; (c != '\0') && (c != '='); c = *(++p))
         {
            adt_str_push(&str, c);
         }
         if (c == '=')
         {
            equal_count++;
            p++;
         }
         arg_len = adt_str_length(&str);
         if ( (arg_len > 0) && (minus_count <= 2u))
         {
            argparse_result_t result = ARGPARSE_PARSE_ERROR;
            switch(minus_count)
            {
            case 0u:
               if (has_short_name)
               {
                  has_short_name = false;
                  result = callback(adt_str_cstr(&short_name), (const char*) 0, adt_str_cstr(&str));
               }
               else if (has_long_name)
               {
                  has_long_name = false;
                  result = callback((const char*) 0, adt_str_cstr(&long_name), adt_str_cstr(&str));
               }
               else
               {
                  //positional argument
                  result = callback((const char*) 0, (const char*) 0, adt_str_cstr(&str));
               }
               break;
            case 1u:
               if (equal_count == 0)
               {
                  result = callback(adt_str_cstr(&str), (const char*) 0, (const char*) 0);
                  if (result == ARGPARSE_NEED_VALUE)
                  {
                     adt_error_t rc = adt_str_set(&short_name, &str);
                     has_short_name = true;
                     if (rc != ADT_NO_ERROR)
                     {
                        ARGPARSE_DESTROY_VARS();
                        return ARGPARSE_MEM_ERROR;
                     }
                  }
               }
               else if (equal_count == 1)
               {
                  adt_error_t rc = adt_str_set(&short_name, &str);
                  if (rc != ADT_NO_ERROR)
                  {
                     ARGPARSE_DESTROY_VARS();
                     return ARGPARSE_MEM_ERROR;
                  }
                  adt_str_clear(&str);
                  for(c = *p; (c != '\0') ; c = *(++p))
                  {
                     adt_str_push(&str, c);
                  }
                  result = callback(adt_str_cstr(&short_name), (const char*) 0, adt_str_cstr(&str));
               }
               else
               {
                  //parse error already set as default
               }
               break;
            case 2u:
               if (equal_count==0)
               {
                  result = callback((const char*) 0, adt_str_cstr(&str), (const char*) 0);
                  if (result == ARGPARSE_NEED_VALUE)
                  {
                     adt_error_t rc = adt_str_set(&long_name, &str);
                     has_long_name = true;
                     if (rc != ADT_NO_ERROR)
                     {
                        ARGPARSE_DESTROY_VARS();
                        return ARGPARSE_MEM_ERROR;
                     }
                  }
               }
               else if (equal_count == 1)
               {
                  adt_error_t rc = adt_str_set(&long_name, &str);
                  if (rc != ADT_NO_ERROR)
                  {
                     ARGPARSE_DESTROY_VARS();
                     return ARGPARSE_MEM_ERROR;
                  }
                  adt_str_clear(&str);
                  for(c = *p; (c != '\0') ; c = *(++p))
                  {
                     adt_str_push(&str, c);
                  }
                  result = callback((const char*) 0, adt_str_cstr(&long_name), adt_str_cstr(&str));
               }
               else
               {
                  //parse error already set as default
               }
               break;
            }
            if (result < 0)
            {
               ARGPARSE_DESTROY_VARS();
               return result;
            }
         }
         else if ((arg_len == 0) && (minus_count == 1))
         {
            /* A standalone minus sign is sometimes used as a positional argument to mean
               stdin/stdout instead of a file name. */

            argparse_result_t result;
            if (has_short_name)
            {
               has_short_name = false;
               result = callback(adt_str_cstr(&short_name), (const char*) 0, "-");
            }
            else if (has_long_name)
            {
               has_long_name = false;
               result = callback((const char*) 0, adt_str_cstr(&long_name), "-");
            }
            else
            {
               result = callback((const char*) 0, (const char*) 0, "-");
            }

            if (result < 0)
            {
               ARGPARSE_DESTROY_VARS();
               return result;
            }
         }
         else
         {
            //User gave empty arg or just typed minus sign(s) with nothing following it or typed three or more minus signs.
            ARGPARSE_DESTROY_VARS();
            return ARGPARSE_PARSE_ERROR;
         }
      }
      ARGPARSE_DESTROY_VARS();
      return ARGPARSE_SUCCESS;
   }
   return ARGPARSE_INVALID_ARGUMENT_ERROR;
}